

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_conversation.cpp
# Opt level: O3

void P_StartConversation(AActor *npc,AActor *pc,bool facetalker,bool saveangle)

{
  byte *pbVar1;
  FStrifeDialogueItemCheck *pFVar2;
  bool bVar3;
  uint uVar4;
  player_t *ppVar5;
  DConversationMenu *this;
  long lVar6;
  AActor *pAVar7;
  long lVar8;
  FStrifeDialogueNode *CurNode;
  FSoundID local_40;
  FSoundID local_3c;
  _func_int **local_38;
  
  if (pc->player == (player_t *)0x0) {
    return;
  }
  ppVar5 = (player_t *)&players;
  lVar6 = 0;
  do {
    if ((playeringame[lVar6] == true) && (ppVar5 != pc->player)) {
      pAVar7 = (ppVar5->ConversationNPC).field_0.p;
      if (pAVar7 == (AActor *)0x0) {
LAB_003e871b:
        pAVar7 = (AActor *)0x0;
      }
      else if (((pAVar7->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
        (ppVar5->ConversationNPC).field_0.p = (AActor *)0x0;
        goto LAB_003e871b;
      }
      if (pAVar7 == npc) {
        return;
      }
    }
    lVar6 = lVar6 + 1;
    ppVar5 = ppVar5 + 1;
  } while (lVar6 != 8);
  (pc->Vel).X = 0.0;
  (pc->Vel).Y = 0.0;
  (pc->Vel).Z = 0.0;
  ppVar5 = pc->player;
  (ppVar5->Vel).X = 0.0;
  (ppVar5->Vel).Y = 0.0;
  APlayerPawn::PlayIdle((APlayerPawn *)pc);
  (pc->player->ConversationPC).field_0.p = pc;
  (pc->player->ConversationNPC).field_0.p = npc;
  pbVar1 = (byte *)((long)&(npc->flags5).Value + 3);
  *pbVar1 = *pbVar1 | 0x20;
  CurNode = npc->Conversation;
  ppVar5 = pc->player;
  if (ppVar5 == (player_t *)(&players + (long)consoleplayer * 0x54)) {
    local_3c.ID = S_FindSound(gameinfo.chatSound.Chars);
    S_Sound(0x22,&local_3c,1.0,0.0);
    ppVar5 = pc->player;
  }
  npc->reactiontime = 2;
  ppVar5->ConversationFaceTalker = facetalker;
  if (saveangle) {
    (ppVar5->ConversationNPCAngle).Degrees = (npc->Angles).Yaw.Degrees;
  }
  pAVar7 = (npc->target).field_0.p;
  if (pAVar7 != (AActor *)0x0) {
    if (((pAVar7->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_003e882e;
    (npc->target).field_0.p = (AActor *)0x0;
  }
  pAVar7 = (AActor *)0x0;
LAB_003e882e:
  (npc->target).field_0.p = pc;
  if (facetalker) {
    A_FaceTarget(npc);
    AActor::AngleTo((AActor *)&stack0xffffffffffffffc8,pc,SUB81(npc,0));
    (pc->Angles).Yaw.Degrees = (double)local_38;
  }
  if ((((npc->flags).Value & 0x8000000) != 0) || (((npc->flags4).Value & 1) != 0)) {
    (npc->target).field_0.p = pAVar7;
  }
  uVar4 = (CurNode->ItemCheck).Count;
  if (uVar4 != 0) {
    while (((CurNode->ItemCheck).Array)->Item != (PClassInventory *)0x0) {
      if (0 < (int)uVar4) {
        lVar8 = 8;
        lVar6 = 0;
        do {
          pFVar2 = (CurNode->ItemCheck).Array;
          bVar3 = CheckStrifeItem(pc->player,*(PClassActor **)((long)pFVar2 + lVar8 + -8),
                                  *(int *)((long)&pFVar2->Item + lVar8));
          if (!bVar3) goto LAB_003e890c;
          lVar6 = lVar6 + 1;
          lVar8 = lVar8 + 0x10;
        } while (lVar6 < (int)(CurNode->ItemCheck).Count);
      }
      if ((long)CurNode->ItemCheckNode < 1) break;
      CurNode = StrifeDialogues.Array
                [(long)((pc->player->ConversationNPC).field_0.p)->ConversationRoot +
                 (long)CurNode->ItemCheckNode + -1];
      uVar4 = (CurNode->ItemCheck).Count;
      if (uVar4 == 0) break;
    }
  }
LAB_003e890c:
  if (pc->player == (player_t *)(&players + (long)consoleplayer * 0x54)) {
    if ((CurNode->SpeakerVoice).ID != 0) {
      I_SetMusicVolume(dlg_musicvolume.Value);
      local_40.ID = (CurNode->SpeakerVoice).ID;
      S_Sound(npc,0x42,&local_40,1.0,1.0);
    }
    this = (DConversationMenu *)
           M_Malloc_Dbg(0x80,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                        ,0x1f9);
    DConversationMenu::DConversationMenu(this,CurNode,pc->player);
    if (CurNode != PrevNode) {
      DConversationMenu::mSelection = 0;
      PrevNode = CurNode;
    }
    M_StartControlPanel(false);
    M_ActivateMenu((DMenu *)this);
    ConversationPauseTic = gametic + 0x14;
    menuactive = MENU_OnNoPause;
  }
  return;
}

Assistant:

void P_StartConversation (AActor *npc, AActor *pc, bool facetalker, bool saveangle)
{
	AActor *oldtarget;
	int i;

	// Make sure this is actually a player.
	if (pc->player == NULL) return;

	// [CW] If an NPC is talking to a PC already, then don't let
	// anyone else talk to the NPC.
	for (i = 0; i < MAXPLAYERS; i++)
	{
		if (!playeringame[i] || pc->player == &players[i])
			continue;

		if (npc == players[i].ConversationNPC)
			return;
	}

	pc->Vel.Zero();
	pc->player->Vel.Zero();
	static_cast<APlayerPawn*>(pc)->PlayIdle ();

	pc->player->ConversationPC = pc;
	pc->player->ConversationNPC = npc;
	npc->flags5 |= MF5_INCONVERSATION;

	FStrifeDialogueNode *CurNode = npc->Conversation;

	if (pc->player == &players[consoleplayer])
	{
		S_Sound (CHAN_VOICE | CHAN_UI, gameinfo.chatSound, 1, ATTN_NONE);
	}

	npc->reactiontime = 2;
	pc->player->ConversationFaceTalker = facetalker;
	if (saveangle)
	{
		pc->player->ConversationNPCAngle = npc->Angles.Yaw;
	}
	oldtarget = npc->target;
	npc->target = pc;
	if (facetalker)
	{
		A_FaceTarget (npc);
		pc->Angles.Yaw = pc->AngleTo(npc);
	}
	if ((npc->flags & MF_FRIENDLY) || (npc->flags4 & MF4_NOHATEPLAYERS))
	{
		npc->target = oldtarget;
	}

	// Check if we should jump to another node
	while (CurNode->ItemCheck.Size() > 0 && CurNode->ItemCheck[0].Item != NULL)
	{
		bool jump = true;
		for (i = 0; i < (int)CurNode->ItemCheck.Size(); ++i)
		{
			if(!CheckStrifeItem (pc->player, CurNode->ItemCheck[i].Item, CurNode->ItemCheck[i].Amount))
			{
				jump = false;
				break;
			}
		}
		if (jump && CurNode->ItemCheckNode > 0)
		{
			int root = pc->player->ConversationNPC->ConversationRoot;
			CurNode = StrifeDialogues[root + CurNode->ItemCheckNode - 1];
		}
		else
		{
			break;
		}
	}

	// The rest is only done when the conversation is actually displayed.
	if (pc->player == &players[consoleplayer])
	{
		if (CurNode->SpeakerVoice != 0)
		{
			I_SetMusicVolume (dlg_musicvolume);
			S_Sound (npc, CHAN_VOICE|CHAN_NOPAUSE, CurNode->SpeakerVoice, 1, ATTN_NORM);
		}

		DConversationMenu *cmenu = new DConversationMenu(CurNode, pc->player);


		if (CurNode != PrevNode)
		{ // Only reset the selection if showing a different menu.
			DConversationMenu::mSelection = 0;
			PrevNode = CurNode;
		}

		// And open the menu
		M_StartControlPanel (false);
		M_ActivateMenu(cmenu);
		ConversationPauseTic = gametic + 20;
		menuactive = MENU_OnNoPause;
	}
}